

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

V5_TextDisplayMode ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(ON_DimStyle *V6_dim_style)

{
  TextLocation TVar1;
  V5_TextDisplayMode VVar2;
  
  VVar2 = kHorizontalToScreen;
  if (V6_dim_style->m_dim_text_orientation != InView) {
    TVar1 = V6_dim_style->m_dim_text_location;
    VVar2 = kAboveLine;
    if (((TVar1 != AboveDimLine) && (TVar1 != BelowDimLine)) &&
       (VVar2 = kNormal, TVar1 == InDimLine)) {
      return (V6_dim_style->m_dim_text_angle_style == Horizontal) + kInLine;
    }
  }
  return VVar2;
}

Assistant:

ON_INTERNAL_OBSOLETE::V5_TextDisplayMode ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(
  const ON_DimStyle& V6_dim_style
)
{
  if (V6_dim_style.DimTextOrientation() == ON::TextOrientation::InView)
  {
    return ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalToScreen;
  }

  switch (V6_dim_style.DimTextLocation())
  {
  case ON_DimStyle::TextLocation::AboveDimLine:
    return ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    break;

  case ON_DimStyle::TextLocation::InDimLine:
    return (ON_DimStyle::ContentAngleStyle::Horizontal == V6_dim_style.DimTextAngleStyle() )
      ? ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kHorizontalInCplane
      : ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
    break;

  case ON_DimStyle::TextLocation::BelowDimLine:
    return ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    break;

  default:
    break;
  }

  return ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
}